

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BinaryPropertyExprSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  PropertyExprSyntax *args_1;
  __fn *args;
  
  args_1 = (PropertyExprSyntax *)__child_stack;
  args = __fn;
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x76c7ef);
  deepClone<slang::syntax::PropertyExprSyntax>
            ((PropertyExprSyntax *)__fn,(BumpAllocator *)__child_stack);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x76c82c);
  deepClone<slang::syntax::PropertyExprSyntax>
            ((PropertyExprSyntax *)__fn,(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryPropertyExprSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     (unaff_retaddr,(SyntaxKind *)args,args_1,(Token *)TVar2.info,TVar2._0_8_);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryPropertyExprSyntax>(
        node.kind,
        *deepClone<PropertyExprSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.right, alloc)
    );
}